

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O2

void __thiscall
cmCTestMultiProcessHandler::FinishTestProcess
          (cmCTestMultiProcessHandler *this,
          unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_> *runner,bool started)

{
  cmCTestRunTest *this_00;
  cmCTestTestProperties *__x;
  pointer puVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  _Base_ptr p_Var5;
  mapped_type_conflict1 *pmVar6;
  undefined7 in_register_00000011;
  undefined4 uVar7;
  pointer puVar8;
  size_t sVar9;
  int test;
  unsigned_long p;
  int local_50;
  undefined4 local_4c;
  _Head_base<0UL,_cmCTestRunTest_*,_false> local_48;
  __uniq_ptr_impl<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_> *local_40;
  unsigned_long local_38;
  
  sVar9 = this->Completed + 1;
  this->Completed = sVar9;
  this_00 = (runner->_M_t).
            super___uniq_ptr_impl<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>._M_t.
            super__Tuple_impl<0UL,_cmCTestRunTest_*,_std::default_delete<cmCTestRunTest>_>.
            super__Head_base<0UL,_cmCTestRunTest_*,_false>._M_head_impl;
  local_50 = this_00->Index;
  __x = this_00->TestProperties;
  uVar7 = (undefined4)CONCAT71(in_register_00000011,started);
  bVar2 = cmCTestRunTest::EndTest(this_00,sVar9,this->Total,started);
  if (((runner->_M_t).super___uniq_ptr_impl<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>.
       _M_t.super__Tuple_impl<0UL,_cmCTestRunTest_*,_std::default_delete<cmCTestRunTest>_>.
       super__Head_base<0UL,_cmCTestRunTest_*,_false>._M_head_impl)->TimeoutIsForStopTime == true) {
    SetStopTimePassed(this);
  }
  if ((started) && (this->StopTimePassed == false)) {
    local_48._M_head_impl =
         (runner->_M_t).super___uniq_ptr_impl<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>.
         _M_t.super__Tuple_impl<0UL,_cmCTestRunTest_*,_std::default_delete<cmCTestRunTest>_>.
         super__Head_base<0UL,_cmCTestRunTest_*,_false>._M_head_impl;
    (runner->_M_t).super___uniq_ptr_impl<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>._M_t.
    super__Tuple_impl<0UL,_cmCTestRunTest_*,_std::default_delete<cmCTestRunTest>_>.
    super__Head_base<0UL,_cmCTestRunTest_*,_false>._M_head_impl = (cmCTestRunTest *)0x0;
    bVar3 = cmCTestRunTest::StartAgain
                      ((unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_> *)&local_48
                       ,this->Completed);
    std::unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>::~unique_ptr
              ((unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_> *)&local_48);
    if (bVar3) {
      this->Completed = this->Completed - 1;
      return;
    }
  }
  lVar4 = 0x168;
  local_4c = uVar7;
  if ((bVar2) || (lVar4 = 0x170, __x->Disabled == false)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(*(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  **)((long)&this->_vptr_cmCTestMultiProcessHandler + lVar4),&__x->Name);
  }
  for (p_Var5 = (this->Tests).
                super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 !=
      &(this->Tests).
       super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
       ._M_t._M_impl.super__Rb_tree_header; p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::erase
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               &p_Var5[1]._M_parent,&local_50);
  }
  local_40 = (__uniq_ptr_impl<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_> *)runner;
  pmVar6 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
           operator[](&this->TestFinishMap,&local_50);
  *pmVar6 = true;
  pmVar6 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
           operator[](&this->TestRunningMap,&local_50);
  *pmVar6 = false;
  WriteCheckpoint(this,local_50);
  DeallocateResources(this,local_50);
  UnlockResources(this,local_50);
  sVar9 = GetProcessorsUsed(this,local_50);
  this->RunningCount = this->RunningCount - sVar9;
  puVar1 = *(pointer *)((long)&__x->Affinity + 8);
  for (puVar8 = (__x->Affinity).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start; puVar8 != puVar1; puVar8 = puVar8 + 1) {
    local_38 = *puVar8;
    std::
    _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
    ::_M_insert_unique<unsigned_long_const&>
              ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                *)&this->ProcessorsAvailable,&local_38);
  }
  puVar8 = (__x->Affinity).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (*(pointer *)((long)&__x->Affinity + 8) != puVar8) {
    *(pointer *)((long)&__x->Affinity + 8) = puVar8;
  }
  std::__uniq_ptr_impl<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>::reset
            (local_40,(pointer)0x0);
  if ((char)local_4c != '\0') {
    StartNextTests(this);
  }
  return;
}

Assistant:

void cmCTestMultiProcessHandler::FinishTestProcess(
  std::unique_ptr<cmCTestRunTest> runner, bool started)
{
  this->Completed++;

  int test = runner->GetIndex();
  auto* properties = runner->GetTestProperties();

  bool testResult = runner->EndTest(this->Completed, this->Total, started);
  if (runner->TimedOutForStopTime()) {
    this->SetStopTimePassed();
  }
  if (started) {
    if (!this->StopTimePassed &&
        cmCTestRunTest::StartAgain(std::move(runner), this->Completed)) {
      this->Completed--; // remove the completed test because run again
      return;
    }
  }

  if (testResult) {
    this->Passed->push_back(properties->Name);
  } else if (!properties->Disabled) {
    this->Failed->push_back(properties->Name);
  }

  for (auto& t : this->Tests) {
    t.second.erase(test);
  }

  this->TestFinishMap[test] = true;
  this->TestRunningMap[test] = false;
  this->WriteCheckpoint(test);
  this->DeallocateResources(test);
  this->UnlockResources(test);
  this->RunningCount -= this->GetProcessorsUsed(test);

  for (auto p : properties->Affinity) {
    this->ProcessorsAvailable.insert(p);
  }
  properties->Affinity.clear();

  runner.reset();
  if (started) {
    this->StartNextTests();
  }
}